

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TessPrimitiveType primType,
          SpacingMode spacing,Winding winding,bool usePointMode)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  byte local_1d;
  Winding local_1c;
  SpacingMode SStack_18;
  bool usePointMode_local;
  Winding winding_local;
  SpacingMode spacing_local;
  TessPrimitiveType primType_local;
  
  winding_local = (Winding)this;
  local_1d = (byte)winding & 1;
  local_1c = spacing;
  SStack_18 = primType;
  _spacing_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_120);
  std::operator+(&local_100,&local_120,"layout (");
  pcVar1 = anon_unknown_1::getTessPrimitiveTypeShaderName(winding_local);
  std::operator+(&local_e0,&local_100,pcVar1);
  std::operator+(&local_c0,&local_e0,", ");
  pcVar1 = anon_unknown_1::getSpacingModeShaderName(SStack_18);
  std::operator+(&local_a0,&local_c0,pcVar1);
  std::operator+(&local_80,&local_a0,", ");
  pcVar1 = anon_unknown_1::getWindingShaderName(local_1c);
  std::operator+(&local_60,&local_80,pcVar1);
  pcVar1 = "";
  if ((local_1d & 1) != 0) {
    pcVar1 = ", point_mode";
  }
  std::operator+(&local_40,&local_60,pcVar1);
  std::operator+(__return_storage_ptr__,&local_40,") in;\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  return __return_storage_ptr__;
}

Assistant:

static inline string getTessellationEvaluationInLayoutString (TessPrimitiveType primType, SpacingMode spacing, Winding winding, bool usePointMode=false)
{
	return string() + "layout (" + getTessPrimitiveTypeShaderName(primType)
								 + ", " + getSpacingModeShaderName(spacing)
								 + ", " + getWindingShaderName(winding)
								 + (usePointMode ? ", point_mode" : "")
								 + ") in;\n";
}